

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BoyerMooreFind.h
# Opt level: O2

BoyerMooreTextFindResult * __thiscall
axl::sl::
BoyerMooreTextFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8ReverseDecoder,_true,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
::find(BoyerMooreTextFindResult *__return_storage_ptr__,
      BoyerMooreTextFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8ReverseDecoder,_true,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
      *this,void *p,size_t size,utf32_t replacementChar)

{
  BoyerMooreTextState state;
  StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_> SStack_c8;
  BoyerMooreTextState local_a8;
  
  StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::StringRefBase
            (&SStack_c8,
             (this->
             super_BoyerMooreFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8ReverseDecoder,_true,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
             ).m_pattern.super_ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>.m_p,
             (this->
             super_BoyerMooreFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8ReverseDecoder,_true,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
             ).m_pattern.super_ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>.m_count,false);
  BoyerMooreTextState::BoyerMooreTextState(&local_a8,&SStack_c8);
  StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::~StringRefBase(&SStack_c8);
  find(__return_storage_ptr__,this,&local_a8,p,size,replacementChar);
  BoyerMooreTextState::~BoyerMooreTextState(&local_a8);
  return __return_storage_ptr__;
}

Assistant:

BoyerMooreTextFindResult
	find(
		const void* p,
		size_t size,
		utf32_t replacementChar = enc::StdChar_Replacement
	) const {
		BoyerMooreTextState state(sl::StringRef_utf32(this->m_pattern, this->m_pattern.getCount()));
		BoyerMooreTextFindResult result = find(&state, p, size, replacementChar);
		if (IsWholeWord && !result.isValid())
			result = eof(&state);
		return result;
	}